

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O3

bool __thiscall
InliningDecider::DeciderInlineIntoInliner
          (InliningDecider *this,FunctionBody *inlinee,FunctionBody *inliner,bool isConstructorCall,
          bool isPolymorphicCall,uint16 constantArgInfo,uint recursiveInlineDepth,
          bool allowRecursiveInlining)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  LocalFunctionId LVar5;
  uint32 uVar6;
  uint32 uVar7;
  uint32 uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined4 *puVar13;
  FunctionInfo *pFVar14;
  undefined4 extraout_var;
  char16 *pcVar15;
  undefined4 extraout_var_00;
  char16 *pcVar16;
  undefined4 extraout_var_01;
  char16 *pcVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  DynamicProfileInfo *pDVar21;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  char16_t *form;
  wchar local_188 [4];
  char16 debugStringBuffer [42];
  wchar local_128 [4];
  char16 debugStringBuffer2 [42];
  wchar local_c8 [4];
  char16 debugStringBuffer3 [42];
  uint local_34;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  bVar3 = CanRecursivelyInline(this,inlinee,inliner,allowRecursiveInlining,recursiveInlineDepth);
  if (!bVar3) {
    return false;
  }
  if ((((inliner->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 ^
       (inlinee->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46) & 2) != 0) {
    return false;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
  if (uVar4 == 0xfffffffe) {
    return true;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
  pFVar1 = this->topFunc;
  pFVar14 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar14 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0055df2f;
    *puVar13 = 0;
    pFVar14 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,InlinePhase,uVar4,pFVar14->functionId);
  if (bVar3) {
    return true;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
  pFVar14 = (inliner->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar14 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0055df2f;
    *puVar13 = 0;
    pFVar14 = (inliner->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,InlinePhase,uVar4,pFVar14->functionId);
  if (bVar3) {
    return true;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
  pFVar14 = (inlinee->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar14 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) {
LAB_0055df2f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar13 = 0;
    pFVar14 = (inlinee->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,InlinePhase,uVar4,pFVar14->functionId);
  if (bVar3) {
    return true;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
  LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,InlinePhase,uVar4,LVar5);
  if (bVar3) {
    return false;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
  LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,InlinePhase,uVar4,LVar5);
  if (bVar3) {
    return false;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
  LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inlinee);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,InlinePhase,uVar4,LVar5);
  if (bVar3) {
    return false;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
  LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,InlineTreePhase,uVar4,LVar5);
  if (bVar3) {
    return true;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
  LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,InlineTreePhase,uVar4,LVar5);
  if (bVar3) {
    return true;
  }
  uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
  LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inlinee);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,InlineAtEveryCallerPhase,uVar4,LVar5);
  if (bVar3) {
    return true;
  }
  uVar6 = Js::FunctionBody::GetCountField(inlinee,ByteCodeWithoutLDACount);
  if (((inlinee->m_argUsedForBranch & constantArgInfo) != 0) && (uVar6 < DAT_015a1ed0)) {
    return true;
  }
  local_34 = (this->threshold).inlineThreshold;
  if (((((!isConstructorCall && !isPolymorphicCall) && (bVar3 = IsInlineeLeaf(inlinee), bVar3)) &&
       (uVar7 = Js::FunctionBody::GetCountField(inlinee,LoopCount), uVar7 < 3)) &&
      ((uVar7 = Js::FunctionBody::GetCountField(inlinee,LoopCount), uVar7 == 0 ||
       (this->numberOfInlineesWithLoop <= (uint)(this->threshold).maxNumberOfInlineesWithLoop)))) &&
     (iVar9 = (this->threshold).leafInlineThreshold, -1 < iVar9)) {
    local_34 = (iVar9 + local_34) - (this->threshold).inlineThreshold;
  }
  uVar7 = Js::FunctionBody::GetCountField(inlinee,LoopCount);
  if (uVar7 != 0) {
    if (((-1 < (this->threshold).loopInlineThreshold) &&
        (this->numberOfInlineesWithLoop <= (uint)(this->threshold).maxNumberOfInlineesWithLoop)) &&
       ((uVar7 = Js::FunctionBody::GetCountField(inlinee,LoopCount), uVar7 < 3 &&
        (((inlinee->field_0x17a | isConstructorCall) & 1) == 0)))) {
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar3 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015a4e90,InlineFunctionsWithLoopsPhase,uVar4,LVar5);
      if (!bVar3) {
        iVar9 = (this->threshold).loopInlineThreshold;
        iVar10 = (this->threshold).inlineThreshold;
        iVar11 = iVar9 - iVar10;
        if (iVar10 <= iVar9) {
          iVar11 = 0;
        }
        local_34 = local_34 + iVar11;
        goto LAB_0055db38;
      }
    }
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlinePhase,uVar4,LVar5);
    if (!bVar3) {
      return false;
    }
    uVar7 = Js::FunctionBody::GetCountField(inlinee,ByteCodeCount);
    uVar6 = this->numberOfInlineesWithLoop;
    uVar8 = Js::FunctionBody::GetCountField(inlinee,LoopCount);
    uVar12 = *(uint *)&inlinee->field_0x178;
    iVar9 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inlinee);
    pcVar15 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inlinee,(wchar (*) [42])local_188);
    iVar10 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
    pcVar16 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inliner,(wchar (*) [42])local_128);
    iVar11 = (*(this->topFunc->super_ParseableFunctionInfo).super_FunctionProxy.
               super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                       ();
    pcVar17 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)this->topFunc,(wchar (*) [42])local_c8);
    Output::Print(L"INLINING: Skip Inline: Has loops \tBytecode size: %d \tgetNumberOfInlineesWithLoop: %d\tloopCount: %d\thasNestedLoop: %d\tisConstructorCall:%d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"
                  ,(ulong)uVar7,uVar6,(ulong)uVar8,(ulong)(uVar12 >> 0x10 & 1),
                  (ulong)isConstructorCall,CONCAT44(extraout_var,iVar9),pcVar15,
                  CONCAT44(extraout_var_00,iVar10),pcVar16,CONCAT44(extraout_var_01,iVar11),pcVar17)
    ;
    goto LAB_0055df01;
  }
LAB_0055db38:
  if (isPolymorphicCall) {
    iVar9 = (this->threshold).polymorphicInlineThreshold;
    if (-1 < iVar9 && !isConstructorCall) {
      iVar10 = (this->threshold).inlineThreshold;
      iVar11 = iVar9 - iVar10;
      if (iVar10 <= iVar9) {
        iVar11 = 0;
      }
      local_34 = local_34 + iVar11;
      goto LAB_0055dc49;
    }
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlinePhase,uVar4,LVar5);
    if (!bVar3) {
      return false;
    }
    uVar12 = (this->threshold).polymorphicInlineThreshold;
    local_34 = Js::FunctionBody::GetCountField(inlinee,ByteCodeCount);
    iVar9 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inlinee);
    uVar18 = CONCAT44(extraout_var_02,iVar9);
    pcVar15 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inlinee,(wchar (*) [42])local_188);
    iVar9 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
    uVar19 = CONCAT44(extraout_var_03,iVar9);
    pcVar16 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inliner,(wchar (*) [42])local_128);
    iVar9 = (*(this->topFunc->super_ParseableFunctionInfo).super_FunctionProxy.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                      ();
    uVar20 = CONCAT44(extraout_var_04,iVar9);
    pcVar17 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)this->topFunc,(wchar (*) [42])local_c8);
    form = 
    L"INLINING: Skip Inline: Polymorphic call under PolymorphicInlineThreshold: %d \tBytecode size: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"
    ;
  }
  else {
LAB_0055dc49:
    if (isConstructorCall) {
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,InlineConstructorsPhase,uVar4,LVar5);
      if (bVar3) {
        return false;
      }
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,InlineConstructorsPhase,uVar4,LVar5);
      if (bVar3) {
        return false;
      }
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inlinee);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,InlineConstructorsPhase,uVar4,LVar5);
      if (bVar3) {
        return false;
      }
      if (DAT_015933b9 != '\x01') {
        return false;
      }
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,InlineConstructorsPhase,uVar4,LVar5);
      if (bVar3) {
        return true;
      }
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,InlineConstructorsPhase,uVar4,LVar5);
      if (bVar3) {
        return true;
      }
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inlinee);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,InlineConstructorsPhase,uVar4,LVar5);
      if (bVar3) {
        return true;
      }
      if (((inlinee->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) &&
         (pDVar21 = Js::FunctionBody::GetAnyDynamicProfileInfo(inlinee),
         ((pDVar21->bits).field_0x3 & 4) != 0)) {
        return true;
      }
      iVar9 = (this->threshold).constructorInlineThreshold;
      if (iVar9 < 0) {
        uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
        LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlinePhase,uVar4,LVar5);
        if (!bVar3) {
          return false;
        }
        uVar6 = Js::FunctionBody::GetCountField(inlinee,ByteCodeCount);
        iVar9 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inlinee);
        pcVar15 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)inlinee,(wchar (*) [42])local_188);
        iVar10 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.
                   super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                   [7])(inliner);
        pcVar16 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)inliner,(wchar (*) [42])local_128);
        iVar11 = (*(this->topFunc->super_ParseableFunctionInfo).super_FunctionProxy.
                   super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                   [7])();
        pcVar17 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)this->topFunc,(wchar (*) [42])local_c8);
        Output::Print(L"INLINING: Skip Inline: Constructor with no polymorphic field access \tBytecode size: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"
                      ,(ulong)uVar6,CONCAT44(extraout_var_08,iVar9),pcVar15,
                      CONCAT44(extraout_var_09,iVar10),pcVar16,CONCAT44(extraout_var_10,iVar11),
                      pcVar17);
        goto LAB_0055df01;
      }
      iVar10 = (this->threshold).inlineThreshold;
      iVar11 = iVar9 - iVar10;
      if (iVar10 <= iVar9) {
        iVar11 = 0;
      }
      local_34 = local_34 + iVar11;
    }
    if ((this->threshold).forLoopBody == true) {
      local_34 = (int)local_34 / DAT_0159efec;
    }
    if (uVar6 <= local_34 && 0 < (int)local_34) {
      uVar6 = Js::FunctionBody::GetCountField(inlinee,LoopCount);
      if (uVar6 != 0) {
        this->numberOfInlineesWithLoop = this->numberOfInlineesWithLoop + 1;
        return true;
      }
      return true;
    }
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlinePhase,uVar4,LVar5);
    if (!bVar3) {
      return false;
    }
    uVar12 = Js::FunctionBody::GetCountField(inlinee,ByteCodeCount);
    iVar9 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inlinee);
    uVar18 = CONCAT44(extraout_var_05,iVar9);
    pcVar15 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inlinee,(wchar (*) [42])local_188);
    iVar9 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
    uVar19 = CONCAT44(extraout_var_06,iVar9);
    pcVar16 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inliner,(wchar (*) [42])local_128);
    iVar9 = (*(this->topFunc->super_ParseableFunctionInfo).super_FunctionProxy.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                      ();
    uVar20 = CONCAT44(extraout_var_07,iVar9);
    pcVar17 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)this->topFunc,(wchar (*) [42])local_c8);
    form = 
    L"INLINING: Skip Inline: Too long \tBytecode size: %d\tThreshold: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"
    ;
  }
  Output::Print(form,(ulong)uVar12,(ulong)local_34,uVar18,pcVar15,uVar19,pcVar16,uVar20,pcVar17);
LAB_0055df01:
  Output::Flush();
  return false;
}

Assistant:

bool InliningDecider::DeciderInlineIntoInliner(Js::FunctionBody * inlinee, Js::FunctionBody * inliner, bool isConstructorCall, bool isPolymorphicCall, uint16 constantArgInfo, uint recursiveInlineDepth, bool allowRecursiveInlining)
{

    if (!CanRecursivelyInline(inlinee, inliner, allowRecursiveInlining, recursiveInlineDepth))
    {
        return false;
    }

    if (inliner->GetIsAsmjsMode() != inlinee->GetIsAsmjsMode())
    {
        return false;
    }
// Force inline all Js Builtins functions
// The existing JsBuiltInForceInline flag can work only when we explictly create scriptFunction
// We can also have methods that we define on the prototype like next of ArrayIterator for which we don't explictly create a script function
// TODO (megupta) : use forceInline for methods defined on the prototype using ObjectDefineProperty
    if (inlinee->GetSourceContextId() == Js::Constants::JsBuiltInSourceContextId ||
        PHASE_FORCE(Js::InlinePhase, this->topFunc) ||
        PHASE_FORCE(Js::InlinePhase, inliner) ||
        PHASE_FORCE(Js::InlinePhase, inlinee))
    {
        return true;
    }

    if (PHASE_OFF(Js::InlinePhase, this->topFunc) ||
        PHASE_OFF(Js::InlinePhase, inliner) ||
        PHASE_OFF(Js::InlinePhase, inlinee))
    {
        return false;
    }

    if (PHASE_FORCE(Js::InlineTreePhase, this->topFunc) ||
        PHASE_FORCE(Js::InlineTreePhase, inliner))
    {
        return true;
    }

    if (PHASE_FORCE(Js::InlineAtEveryCallerPhase, inlinee))
    {
        return true;
    }

    uint inlineeByteCodeCount = inlinee->GetByteCodeWithoutLDACount();

    // Heuristics are hit in the following order (Note *order* is important)
    // 1. Leaf function:  If the inlinee is a leaf (but not a constructor or a polymorphic call) inline threshold is LeafInlineThreshold (60). Also it can have max 1 loop
    // 2. Constant Function Argument: If the inlinee candidate has a constant argument and that argument is used for branching, then the inline threshold is ConstantArgumentInlineThreshold (157)
    // 3. InlineThreshold: If an inlinee candidate exceeds InlineThreshold just don't inline no matter what.

    // Following are additional constraint for an inlinee which meets InlineThreshold (Rule no 3)
    // 4. Rule for inlinee with loops:
    //      4a. Only single loop in inlinee is permitted.
    //      4b. Should not have polymorphic field access.
    //      4c. Should not be a constructor.
    //      4d. Should meet LoopInlineThreshold (25)
    // 5. Rule for polymorphic inlinee:
    //      4a. Should meet PolymorphicInlineThreshold (32)
    // 6. Rule for constructors:
    //       5a. Always inline if inlinee has polymorphic field access (as we have cloned runtime data).
    //       5b. If inlinee is monomorphic, inline only small constructors. They are governed by ConstructorInlineThreshold (21)
    // 7. Rule for inlinee which is not interpreted enough (as we might not have all the profile data):
    //       7a. As of now it is still governed by the InlineThreshold. Plan to play with this in future.
    // 8. Rest should be inlined.

    uint16 mask = constantArgInfo &  inlinee->m_argUsedForBranch;
    if (mask && inlineeByteCodeCount <  (uint)CONFIG_FLAG(ConstantArgumentInlineThreshold))
    {
        return true;
    }

    int inlineThreshold = threshold.inlineThreshold;
    if (!isPolymorphicCall && !isConstructorCall && IsInlineeLeaf(inlinee) && (inlinee->GetLoopCount() <= 2))
    {
        // Inlinee is a leaf function
        if (inlinee->GetLoopCount() == 0 || GetNumberOfInlineesWithLoop() <= (uint)threshold.maxNumberOfInlineesWithLoop) // Don't inlinee too many inlinees with loops.
        {
            // Negative LeafInlineThreshold disable the threshold
            if (threshold.leafInlineThreshold >= 0)
            {
                inlineThreshold += threshold.leafInlineThreshold - threshold.inlineThreshold;
            }
        }
    }

#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer3[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    if (inlinee->GetHasLoops())
    {
        if (threshold.loopInlineThreshold < 0 ||                                     // Negative LoopInlineThreshold disable inlining with loop
            GetNumberOfInlineesWithLoop()  >(uint)threshold.maxNumberOfInlineesWithLoop || // See if we are inlining too many inlinees with loops.
            (inlinee->GetLoopCount() > 2) ||                                         // Allow at most 2 loops.
            inlinee->GetHasNestedLoop() ||                                           // Nested loops are not a good inlinee candidate
            isConstructorCall ||                                                     // If the function is constructor with loops, don't inline.
            PHASE_OFF(Js::InlineFunctionsWithLoopsPhase, this->topFunc))
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Has loops \tBytecode size: %d \tgetNumberOfInlineesWithLoop: %d\tloopCount: %d\thasNestedLoop: %d\tisConstructorCall:%d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"),
                inlinee->GetByteCodeCount(),
                GetNumberOfInlineesWithLoop(),
                inlinee->GetLoopCount(),
                inlinee->GetHasNestedLoop(),
                isConstructorCall,
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
                inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
                topFunc->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3));
            // Don't inline function with loops
            return false;
        }
        else
        {
            inlineThreshold -= (threshold.inlineThreshold > threshold.loopInlineThreshold) ? threshold.inlineThreshold - threshold.loopInlineThreshold : 0;
        }
    }

    if (isPolymorphicCall)
    {
        if (threshold.polymorphicInlineThreshold < 0 ||                              // Negative PolymorphicInlineThreshold disable inlining
            isConstructorCall)
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Polymorphic call under PolymorphicInlineThreshold: %d \tBytecode size: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"),
                threshold.polymorphicInlineThreshold,
                inlinee->GetByteCodeCount(),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
                inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
                topFunc->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3));
            return false;
        }
        else
        {
            inlineThreshold -= (threshold.inlineThreshold > threshold.polymorphicInlineThreshold) ? threshold.inlineThreshold - threshold.polymorphicInlineThreshold : 0;
        }
    }

    if (isConstructorCall)
    {
#pragma prefast(suppress: 6285, "logical-or of constants is by design")
        if (PHASE_OFF(Js::InlineConstructorsPhase, this->topFunc) ||
            PHASE_OFF(Js::InlineConstructorsPhase, inliner) ||
            PHASE_OFF(Js::InlineConstructorsPhase, inlinee) ||
            !CONFIG_FLAG(CloneInlinedPolymorphicCaches))
        {
            return false;
        }

        if (PHASE_FORCE(Js::InlineConstructorsPhase, this->topFunc) ||
            PHASE_FORCE(Js::InlineConstructorsPhase, inliner) ||
            PHASE_FORCE(Js::InlineConstructorsPhase, inlinee))
        {
            return true;
        }

        if (inlinee->HasDynamicProfileInfo() && inlinee->GetAnyDynamicProfileInfo()->HasPolymorphicFldAccess())
        {
            // As of now this is not dependent on bytecodeInlinedThreshold.
            return true;
        }

        // Negative ConstructorInlineThreshold always disable constructor inlining
        if (threshold.constructorInlineThreshold < 0)
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Constructor with no polymorphic field access \tBytecode size: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"),
                inlinee->GetByteCodeCount(),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
                inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
                topFunc->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3));
            // Don't inline constructor that does not have a polymorphic field access, or if cloning polymorphic inline
            // caches is disabled
            return false;
        }
        else
        {
            inlineThreshold -= (threshold.inlineThreshold > threshold.constructorInlineThreshold) ? threshold.inlineThreshold - threshold.constructorInlineThreshold : 0;
        }
    }

    if (threshold.forLoopBody)
    {
        inlineThreshold /= CONFIG_FLAG(InlineInLoopBodyScaleDownFactor);
    }

    if (inlineThreshold > 0 && inlineeByteCodeCount <= (uint)inlineThreshold)
    {
        if (inlinee->GetLoopCount())
        {
            IncrementNumberOfInlineesWithLoop();
        }
        return true;
    }
    else
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: Too long \tBytecode size: %d\tThreshold: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"),
            inlinee->GetByteCodeCount(),
            inlineThreshold,
            inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
            inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
            topFunc->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3));
        return false;
    }
}